

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void processarg<main::__4>(string *arg,anon_class_64_4_986e26b8 *act,bool mustexist)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  char *pcVar10;
  char *pcVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar12;
  bool bVar13;
  string fullname;
  string srcname;
  string romname;
  string local_258;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  actionlist *local_208;
  string *psStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  actionlist *local_1c8;
  string *psStack_1c0;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  bool local_178;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  actionlist *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_138 [8];
  undefined1 local_b0 [16];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  actionlist *local_80;
  string *psStack_78;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  actionlist *local_40;
  string *psStack_38;
  
  lVar4 = std::__cxx11::string::find((char)arg,0x3d);
  if (lVar4 == -1) {
    if (*(arg->_M_dataplus)._M_p == '@') {
      std::__cxx11::string::substr((ulong)local_238,(ulong)arg);
      MmapReader::MmapReader((MmapReader *)local_170,local_238);
      if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
      local_1b8 = (act->extractfilter).
                  super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1b0 = (act->extractfilter).
                  super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
        }
      }
      local_1a8 = local_198;
      pcVar2 = (act->filesystemname)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,pcVar2,pcVar2 + (act->filesystemname)._M_string_length);
      local_188 = *(undefined4 *)&act->actions;
      uStack_184 = *(undefined4 *)((long)&act->actions + 4);
      uStack_180 = *(undefined4 *)&act->savedir;
      uStack_17c = *(undefined4 *)((long)&act->savedir + 4);
      local_178 = mustexist;
      lVar4 = (**(code **)(local_170._0_8_ + 0x30))();
      pcVar10 = (char *)(local_150._M_allocated_capacity + local_160._M_allocated_capacity);
      pcVar12 = (char *)(lVar4 + local_160._M_allocated_capacity);
      do {
        if (pcVar12 <= pcVar10) break;
        lVar4 = (long)pcVar12 - (long)pcVar10 >> 2;
        pcVar5 = pcVar10;
        if (0 < lVar4) {
          pcVar5 = pcVar10 + ((long)pcVar12 - (long)pcVar10 & 0xfffffffffffffffc);
          lVar4 = lVar4 + 1;
          pcVar11 = pcVar10 + 3;
          do {
            if ((pcVar11[-3] == '\n') || (pcVar11[-3] == '\r')) {
              pcVar11 = pcVar11 + -3;
              goto LAB_0011085c;
            }
            if ((pcVar11[-2] == '\n') || (pcVar11[-2] == '\r')) {
              pcVar11 = pcVar11 + -2;
              goto LAB_0011085c;
            }
            if ((pcVar11[-1] == '\n') || (pcVar11[-1] == '\r')) {
              pcVar11 = pcVar11 + -1;
              goto LAB_0011085c;
            }
            if ((*pcVar11 == '\n') || (*pcVar11 == '\r')) goto LAB_0011085c;
            lVar4 = lVar4 + -1;
            pcVar11 = pcVar11 + 4;
          } while (1 < lVar4);
        }
        lVar4 = (long)pcVar12 - (long)pcVar5;
        if (lVar4 == 1) {
LAB_00110849:
          pcVar11 = pcVar5;
          if ((*pcVar5 != '\n') && (*pcVar5 != '\r')) {
            pcVar11 = pcVar12;
          }
        }
        else if (lVar4 == 2) {
LAB_00110823:
          pcVar11 = pcVar5;
          if ((*pcVar5 != '\n') && (*pcVar5 != '\r')) {
            pcVar5 = pcVar5 + 1;
            goto LAB_00110849;
          }
        }
        else {
          pcVar11 = pcVar12;
          if (((lVar4 == 3) && (pcVar11 = pcVar5, *pcVar5 != '\n')) && (*pcVar5 != '\r')) {
            pcVar5 = pcVar5 + 1;
            goto LAB_00110823;
          }
        }
LAB_0011085c:
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,pcVar10,pcVar11);
        local_238._0_8_ = local_1b8;
        local_238._8_8_ = local_1b0;
        if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
          }
        }
        local_228._M_allocated_capacity = (size_type)&local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_238 + 0x10),local_1a8,local_1a0 + (long)local_1a8);
        local_208 = (actionlist *)CONCAT44(uStack_184,local_188);
        psStack_200 = (string *)CONCAT44(uStack_17c,uStack_180);
        processarg<main::__4>(&local_258,(anon_class_64_4_986e26b8 *)local_238,local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_allocated_capacity != &local_218) {
          operator_delete((void *)local_228._M_allocated_capacity,
                          local_218._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (pcVar11 < pcVar12) {
          bVar13 = true;
          cVar1 = *pcVar11;
          while (cVar1 == '\r') {
            pcVar11 = pcVar11 + 1;
            bVar13 = pcVar11 < pcVar12;
            if (!bVar13) goto LAB_0011096c;
            cVar1 = *pcVar11;
          }
          if (!bVar13) goto LAB_0011096c;
          pcVar10 = pcVar11 + (*pcVar11 == '\n');
          bVar13 = true;
        }
        else {
LAB_0011096c:
          bVar13 = false;
        }
      } while (bVar13);
      if (local_1a8 != local_198) {
        operator_delete(local_1a8,local_198[0] + 1);
      }
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
      }
      MmapReader::~MmapReader((MmapReader *)local_170);
    }
    else {
      iVar3 = GetFileInfo<char>(arg);
      if (iVar3 == 3) {
        local_70._0_8_ =
             (act->extractfilter).super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_70._8_8_ =
             (act->extractfilter).super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
          }
        }
        pcVar2 = (act->filesystemname)._M_dataplus._M_p;
        local_60._M_p = (pointer)&local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar2,pcVar2 + (act->filesystemname)._M_string_length);
        local_40 = act->actions;
        psStack_38 = act->savedir;
        handlepath<main::__4>(arg,(anon_class_64_4_986e26b8 *)local_70);
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_p != &local_50) {
          operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_;
        }
      }
      else if (iVar3 == 2) {
        local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(act->extractfilter).
                       super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1f0 = (act->extractfilter).
                    super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
          }
        }
        local_1e8 = local_1d8;
        pcVar2 = (act->filesystemname)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar2,pcVar2 + (act->filesystemname)._M_string_length);
        local_1c8 = act->actions;
        psStack_1c0 = act->savedir;
        __dirp = opendir((arg->_M_dataplus)._M_p);
        if (__dirp != (DIR *)0x0) {
          pdVar6 = readdir(__dirp);
          if (pdVar6 != (dirent *)0x0) {
            do {
              local_238._0_8_ = local_238 + 0x10;
              sVar7 = strlen(pdVar6->d_name);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_238,pdVar6->d_name,pdVar6->d_name + sVar7);
              iVar3 = std::__cxx11::string::compare((char *)local_238);
              if ((iVar3 != 0) &&
                 (iVar3 = std::__cxx11::string::compare((char *)local_238), iVar3 != 0)) {
                local_170._0_8_ = &local_160;
                pcVar2 = (arg->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_170,pcVar2,pcVar2 + arg->_M_string_length);
                std::__cxx11::string::append((char *)local_170);
                plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_170,local_238._0_8_);
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                psVar9 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_258.field_2._M_allocated_capacity = *psVar9;
                  local_258.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_258.field_2._M_allocated_capacity = *psVar9;
                  local_258._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_258._M_string_length = plVar8[1];
                *plVar8 = (long)psVar9;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._0_8_ != &local_160) {
                  operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
                }
                if (pdVar6->d_type == '\x04') {
                  printf("NOTE: not processing subdirectory %s\n",local_258._M_dataplus._M_p);
                }
                if (pdVar6->d_type == '\b') {
                  local_170._0_8_ = local_1f8;
                  local_170._8_8_ = local_1f0;
                  if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
                    }
                  }
                  local_160._M_allocated_capacity = (size_type)&local_150;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_160,local_1e8,local_1e0 + (long)local_1e8);
                  local_140 = local_1c8;
                  aaStack_138[0]._M_allocated_capacity = psStack_1c0;
                  handlepath<main::__4>(&local_258,(anon_class_64_4_986e26b8 *)local_170);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160._M_allocated_capacity != &local_150) {
                    operator_delete((void *)local_160._M_allocated_capacity,
                                    local_150._M_allocated_capacity + 1);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
              }
              if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
                operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
              }
              pdVar6 = readdir(__dirp);
            } while (pdVar6 != (dirent *)0x0);
          }
          closedir(__dirp);
        }
        this = local_1f0;
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
          this = local_1f0;
        }
      }
      else {
        if (mustexist) {
          printf("WARNING: %s does not exist\n",(arg->_M_dataplus)._M_p);
          return;
        }
        local_b0._0_8_ =
             (act->extractfilter).super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_b0._8_8_ =
             (act->extractfilter).super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_)->_M_use_count + 1;
          }
        }
        pcVar2 = (act->filesystemname)._M_dataplus._M_p;
        local_a0._M_p = (pointer)&local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar2,pcVar2 + (act->filesystemname)._M_string_length);
        local_80 = act->actions;
        psStack_78 = act->savedir;
        handlepath<main::__4>(arg,(anon_class_64_4_986e26b8 *)local_b0);
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_p != &local_90) {
          operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_170,(ulong)arg);
    std::__cxx11::string::substr((ulong)local_238,(ulong)arg);
    main::anon_class_64_4_986e26b8::operator()(act,(string *)local_238,(string *)local_170);
    if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._0_8_ != &local_160) {
      operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void processarg(const std::string& arg, ACTION act, bool mustexist)
{
    size_t ieq= arg.find('=');
    if (ieq!=std::string::npos) {
        //  <rom>=<src>
        std::string romname= arg.substr(0,ieq);
        std::string srcname= arg.substr(ieq+1);
        act(srcname, romname);
    }
    else if (arg[0]=='@') {
        // if name starts with '@' -> read list from file
        MmapReader rl(arg.substr(1), MmapReader::readonly);

        rl.line_enumerator([act,mustexist](const char *first, const char*last)->bool {
            processarg(std::string(first, last-first), act, mustexist);
            return true;
        });
    }
    else switch (GetFileInfo(arg)) {
        case AT_ISDIRECTORY:
            // if <arg> is a directory -> add all files in that directory
            dir_iterator(arg, [act](const std::string& srcpath) {
                    handlepath(srcpath, act);
                },
                [](const std::string& dirname)->bool { printf("NOTE: not processing subdirectory %s\n", dirname.c_str()); return false; }
            );
            break;
        case AT_ISFILE:
            handlepath(arg, act);
            break;
        default:
            if (mustexist)
                printf("WARNING: %s does not exist\n", arg.c_str());
            else
                handlepath(arg, act);
    }
}